

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

PsbtBip32PubkeyInputStruct * __thiscall
cfd::js::api::json::PsbtBip32PubkeyInput::ConvertToStruct
          (PsbtBip32PubkeyInputStruct *__return_storage_ptr__,PsbtBip32PubkeyInput *this)

{
  PsbtBip32PubkeyInput *this_local;
  PsbtBip32PubkeyInputStruct *result;
  
  PsbtBip32PubkeyInputStruct::PsbtBip32PubkeyInputStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->descriptor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->pubkey,(string *)&this->pubkey_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->master_fingerprint,
             (string *)&this->master_fingerprint_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->path,(string *)&this->path_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

PsbtBip32PubkeyInputStruct PsbtBip32PubkeyInput::ConvertToStruct() const {  // NOLINT
  PsbtBip32PubkeyInputStruct result;
  result.descriptor = descriptor_;
  result.pubkey = pubkey_;
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.ignore_items = ignore_items;
  return result;
}